

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O1

bool __thiscall
cppcms::impl::file_server::is_in_root
          (file_server *this,string *input_path,string *root,string *real)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  file_server *this_00;
  string normal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_90;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  
  pcVar1 = (root->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + root->_M_string_length);
  std::__cxx11::string::append((char *)local_70);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(input_path->_M_dataplus)._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar4;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  this_00 = (file_server *)&stack0xffffffffffffffb0;
  local_50._M_p = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char*>((string *)this_00,local_90,lVar2 + (long)local_90);
  bVar3 = canonical(this_00,(string *)&stack0xffffffffffffffb0,real);
  if (local_50._M_p != &stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p);
  }
  if (bVar3) {
    bVar3 = is_file_prefix(root,real);
  }
  else {
    bVar3 = false;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return bVar3;
}

Assistant:

bool file_server::is_in_root(std::string const &input_path,std::string const &root,std::string &real)
{
	std::string normal=root + "/" + input_path;
	if(!canonical(normal,real))
		return false;
	if(!is_file_prefix(root,real))
		return false;
	return true;
}